

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::LoadSuperObject(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  Symbol *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  
  pSVar1 = funcInfo->superSymbol;
  if (pSVar1 == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x8dc,"(superSym)","superSym");
    if (!bVar3) goto LAB_0075e8b3;
    *puVar5 = 0;
  }
  BVar4 = FuncInfo::IsLambda(funcInfo);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x8dd,"(!funcInfo->IsLambda())","!funcInfo->IsLambda()");
    if (!bVar3) {
LAB_0075e8b3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  Js::ByteCodeWriter::Reg1(&this->m_writer,LdHomeObj,pSVar1->location);
  return;
}

Assistant:

void ByteCodeGenerator::LoadSuperObject(FuncInfo *funcInfo)
{
    Symbol* superSym = funcInfo->GetSuperSymbol();
    Assert(superSym);
    Assert(!funcInfo->IsLambda());

    m_writer.Reg1(Js::OpCode::LdHomeObj, superSym->GetLocation());
}